

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O3

void __thiscall MutableS2ShapeIndex::MutableS2ShapeIndex(MutableS2ShapeIndex *this,Options *options)

{
  (this->super_S2ShapeIndex)._vptr_S2ShapeIndex = (_func_int **)&PTR__MutableS2ShapeIndex_002bb130;
  (this->shapes_).
  super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->shapes_).
  super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->shapes_).
  super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cell_map_).
  super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
  .
  super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
  .
  super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
  .tree_.root_.
  super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
  .
  super_Storage<absl::container_internal::CompressedTuple<std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_*>,_2UL,_false>
       = (Storage<absl::container_internal::CompressedTuple<std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_*>,_2UL,_false>
          )0x0;
  (this->cell_map_).
  super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
  .
  super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
  .
  super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
  .tree_.rightmost_ = (node_type *)0x0;
  (this->cell_map_).
  super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
  .
  super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
  .
  super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
  .tree_.size_ = 0;
  (this->options_).max_edges_per_cell_ = options->max_edges_per_cell_;
  this->pending_additions_begin_ = 0;
  (this->pending_removals_)._M_t.
  super___uniq_ptr_impl<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>,_std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_*,_std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>_>
  .
  super__Head_base<0UL,_std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_*,_false>
  ._M_head_impl =
       (vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
        *)0x0;
  (this->lock_).locked_._M_base._M_i = false;
  (this->index_status_)._M_i = FRESH;
  (this->update_state_)._M_t.
  super___uniq_ptr_impl<MutableS2ShapeIndex::UpdateState,_std::default_delete<MutableS2ShapeIndex::UpdateState>_>
  ._M_t.
  super__Tuple_impl<0UL,_MutableS2ShapeIndex::UpdateState_*,_std::default_delete<MutableS2ShapeIndex::UpdateState>_>
  .super__Head_base<0UL,_MutableS2ShapeIndex::UpdateState_*,_false>._M_head_impl =
       (UpdateState *)0x0;
  return;
}

Assistant:

MutableS2ShapeIndex::MutableS2ShapeIndex(const Options& options)
    : options_(options),
      index_status_(FRESH) {
}